

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O1

void sha1_end(uchar *hval,sha1_ctx *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = ctx->count[0];
  uVar2 = uVar3 & 0x3f;
  if (uVar2 != 0) {
    uVar6 = (ulong)((uVar3 & 0x3f) + 3 >> 2);
    do {
      uVar1 = ctx->hash[uVar6 + 4];
      ctx->hash[uVar6 + 4] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  bVar4 = ~(byte)(uVar3 << 3) & 0x18;
  *(uint *)((long)ctx->wbuf + (ulong)(uVar3 & 0x3c)) =
       0x80 << bVar4 | -0x80 << bVar4 & *(uint *)((long)ctx->wbuf + (ulong)(uVar3 & 0x3c));
  if (uVar2 < 0x38) {
    uVar3 = (uVar2 >> 2) + 1;
  }
  else {
    if (uVar2 < 0x3c) {
      ctx->wbuf[0xf] = 0;
    }
    sha1_compile(ctx);
    uVar3 = 0;
  }
  if (uVar3 < 0xe) {
    memset(ctx->wbuf + uVar3,0,(ulong)(0xd - uVar3) * 4 + 4);
  }
  uVar3 = ctx->count[0];
  ctx->wbuf[0xe] = ctx->count[1] << 3 | uVar3 >> 0x1d;
  ctx->wbuf[0xf] = uVar3 << 3;
  sha1_compile(ctx);
  bVar4 = 0;
  lVar5 = 0;
  do {
    hval[lVar5] = (uchar)(*(uint *)((long)ctx->hash + (ulong)((uint)lVar5 & 0xfffffffc)) >>
                         (~bVar4 & 0x18));
    lVar5 = lVar5 + 1;
    bVar4 = bVar4 + 8;
  } while (lVar5 != 0x14);
  return;
}

Assistant:

VOID_RETURN sha1_end(unsigned char hval[], sha1_ctx ctx[1])
{   uint_32t    i = (uint_32t)(ctx->count[0] & SHA1_MASK);

    /* put bytes in the buffer in an order in which references to   */
    /* 32-bit words will put bytes with lower addresses into the    */
    /* top of 32 bit words on BOTH big and little endian machines   */
    bsw_32(ctx->wbuf, (i + 3) >> 2);

    /* we now need to mask valid bytes and add the padding which is */
    /* a single 1 bit and as many zero bits as necessary. Note that */
    /* we can always add the first padding byte here because the    */
    /* buffer always has at least one empty slot                    */
    ctx->wbuf[i >> 2] &= 0xffffff80 << 8 * (~i & 3);
    ctx->wbuf[i >> 2] |= 0x00000080 << 8 * (~i & 3);

    /* we need 9 or more empty positions, one for the padding byte  */
    /* (above) and eight for the length count. If there is not      */
    /* enough space, pad and empty the buffer                       */
    if(i > SHA1_BLOCK_SIZE - 9)
    {
        if(i < 60) ctx->wbuf[15] = 0;
        sha1_compile(ctx);
        i = 0;
    }
    else    /* compute a word index for the empty buffer positions  */
        i = (i >> 2) + 1;

    while(i < 14) /* and zero pad all but last two positions        */
        ctx->wbuf[i++] = 0;

    /* the following 32-bit length fields are assembled in the      */
    /* wrong byte order on little endian machines but this is       */
    /* corrected later since they are only ever used as 32-bit      */
    /* word values.                                                 */
    ctx->wbuf[14] = (ctx->count[1] << 3) | (ctx->count[0] >> 29);
    ctx->wbuf[15] = ctx->count[0] << 3;
    sha1_compile(ctx);

    /* extract the hash value as bytes in case the hash buffer is   */
    /* misaligned for 32-bit words                                  */
    for(i = 0; i < SHA1_DIGEST_SIZE; ++i)
        hval[i] = (unsigned char)(ctx->hash[i >> 2] >> (8 * (~i & 3)));
}